

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject.cpp
# Opt level: O0

ostream * bidfx_public_api::price::subject::operator<<(ostream *os,Subject *s)

{
  ostream *poVar1;
  string local_38;
  Subject *local_18;
  Subject *s_local;
  ostream *os_local;
  
  local_18 = s;
  s_local = (Subject *)os;
  Subject::ToString_abi_cxx11_(&local_38,s);
  poVar1 = std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Subject& s)
{
    return os << s.ToString();
}